

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_handle_lifetime.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZESHandleLifetimeValidation::zesVFManagementGetVFPropertiesExpPrologue
          (ZESHandleLifetimeValidation *this,zes_vf_handle_t hVFhandle,
          zes_vf_exp_properties_t *pProperties)

{
  ze_result_t zVar1;
  iterator iVar2;
  zes_vf_handle_t local_8;
  
  local_8 = hVFhandle;
  iVar2 = std::
          _Hashtable<void_*,_std::pair<void_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<void_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<void_*,_std::pair<void_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<void_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(*(long *)(context + 0xd48) + 0x18),&local_8);
  zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (iVar2.
      super__Node_iterator_base<std::pair<void_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    zVar1 = ZE_RESULT_SUCCESS;
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZESHandleLifetimeValidation::zesVFManagementGetVFPropertiesExpPrologue(
        zes_vf_handle_t hVFhandle,                      ///< [in] Sysman handle for the VF component.
        zes_vf_exp_properties_t* pProperties            ///< [in,out] Will contain VF properties.
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hVFhandle )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }